

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct_compress.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  char *__s1;
  uint image_width;
  uint image_height;
  int iVar1;
  FILE *__stream;
  pointer compress_callback;
  void *__buf;
  FILE *__n;
  J_COLOR_SPACE local_180;
  J_COLOR_SPACE local_17c;
  size_t len;
  Pl_DCT dct;
  uchar buf [100];
  function<void_(jpeg_compress_struct_*)> local_c0;
  undefined1 local_a0 [8];
  unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_> config;
  anon_class_8_1_4f9d58bb callback;
  undefined1 local_88 [7];
  bool called;
  Pl_StdioFile out;
  FILE *outfile;
  FILE *infile;
  int components;
  J_COLOR_SPACE cs;
  char *colorspace;
  JDIMENSION height;
  JDIMENSION width;
  char *outfilename;
  char *infilename;
  char **argv_local;
  int argc_local;
  
  if (argc != 6) {
    usage();
  }
  filename = argv[1];
  filename_00 = argv[2];
  image_width = QUtil::string_to_uint(argv[3]);
  image_height = QUtil::string_to_uint(argv[4]);
  __s1 = argv[5];
  iVar1 = strcmp(__s1,"rgb");
  if (iVar1 == 0) {
    local_17c = JCS_RGB;
  }
  else {
    iVar1 = strcmp(__s1,"cmyk");
    if (iVar1 == 0) {
      local_180 = JCS_CMYK;
    }
    else {
      iVar1 = strcmp(__s1,"gray");
      local_180 = (J_COLOR_SPACE)(iVar1 == 0);
    }
    local_17c = local_180;
  }
  infile._0_4_ = 0;
  if (local_17c == JCS_GRAYSCALE) {
    infile._0_4_ = 1;
  }
  else if (local_17c == JCS_RGB) {
    infile._0_4_ = 3;
  }
  else if (local_17c == JCS_CMYK) {
    infile._0_4_ = 4;
  }
  else {
    usage();
  }
  __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
  out.m._M_t.
  super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>.
  super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl =
       (__uniq_ptr_data<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>,_true,_true>
        )QUtil::safe_fopen(filename_00,"wb");
  Pl_StdioFile::Pl_StdioFile
            ((Pl_StdioFile *)local_88,"stdout",
             (FILE *)out.m._M_t.
                     super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                     .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl);
  callback.called._7_1_ = 0;
  config._M_t.
  super___uniq_ptr_impl<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_>._M_t.
  super__Tuple_impl<0UL,_Pl_DCT::CompressConfig_*,_std::default_delete<Pl_DCT::CompressConfig>_>.
  super__Head_base<0UL,_Pl_DCT::CompressConfig_*,_false>._M_head_impl =
       (__uniq_ptr_data<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>,_true,_true>
        )((long)&callback.called + 7);
  std::function<void(jpeg_compress_struct*)>::function<main::__0&,void>
            ((function<void(jpeg_compress_struct*)> *)&local_c0,(anon_class_8_1_4f9d58bb *)&config);
  Pl_DCT::make_compress_config((Pl_DCT *)local_a0,&local_c0);
  std::function<void_(jpeg_compress_struct_*)>::~function(&local_c0);
  compress_callback =
       std::unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_>::get
                 ((unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_>
                   *)local_a0);
  Pl_DCT::Pl_DCT((Pl_DCT *)&len,"dct",(Pipeline *)local_88,image_width,image_height,(int)infile,
                 local_17c,compress_callback);
  while (__n = __stream, __buf = (void *)fread(&dct.m,1,100,__stream), __buf != (void *)0x0) {
    Pl_DCT::write((Pl_DCT *)&len,(int)&dct + 0x30,__buf,(size_t)__n);
  }
  Pl_DCT::finish((Pl_DCT *)&len);
  if ((callback.called._7_1_ & 1) != 0) {
    fclose(__stream);
    fclose((FILE *)out.m._M_t.
                   super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                   .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl);
    Pl_DCT::~Pl_DCT((Pl_DCT *)&len);
    std::unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_>::
    ~unique_ptr((unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_> *)
                local_a0);
    Pl_StdioFile::~Pl_StdioFile((Pl_StdioFile *)local_88);
    return 0;
  }
  __assert_fail("called",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/dct_compress.cc"
                ,0x40,"int main(int, char **)");
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 6) {
        usage();
    }

    char* infilename = argv[1];
    char* outfilename = argv[2];
    JDIMENSION width = QUtil::string_to_uint(argv[3]);
    JDIMENSION height = QUtil::string_to_uint(argv[4]);
    char* colorspace = argv[5];
    J_COLOR_SPACE cs =
        ((strcmp(colorspace, "rgb") == 0)        ? JCS_RGB
             : (strcmp(colorspace, "cmyk") == 0) ? JCS_CMYK
             : (strcmp(colorspace, "gray") == 0) ? JCS_GRAYSCALE
                                                 : JCS_UNKNOWN);
    int components = 0;
    switch (cs) {
    case JCS_RGB:
        components = 3;
        break;
    case JCS_CMYK:
        components = 4;
        break;
    case JCS_GRAYSCALE:
        components = 1;
        break;
    default:
        usage();
        break;
    }

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    Pl_StdioFile out("stdout", outfile);
    bool called = false;
    auto callback = [&called](jpeg_compress_struct*) { called = true; };
    auto config = Pl_DCT::make_compress_config(callback);
    unsigned char buf[100];
    Pl_DCT dct("dct", &out, width, height, components, cs, config.get());
    while (size_t len = fread(buf, 1, sizeof(buf), infile)) {
        dct.write(buf, len);
    }
    dct.finish();
    assert(called);

    fclose(infile);
    fclose(outfile);
    return 0;
}